

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patcher.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
StringToBytes(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
             string *str)

{
  pointer pcVar1;
  string s;
  allocator_type local_39;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  long local_30;
  long local_28 [2];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_38._M_current = (char *)local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + str->_M_string_length);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,local_38,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_38._M_current + local_30),&local_39);
  if ((long *)local_38._M_current != local_28) {
    operator_delete(local_38._M_current,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> StringToBytes(const std::string& str) {
    
    std::string s(str);
    return std::vector<uint8_t> (s.begin(), s.end());
}